

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::SocketTest_MockSocketHello_Test::TestBody(SocketTest_MockSocketHello_Test *this)

{
  bool bVar1;
  pointer puVar2;
  undefined8 *puVar3;
  size_type sVar4;
  AssertHelper AVar5;
  MockSocket *pMVar6;
  undefined2 uVar7;
  int iVar8;
  pointer *__ptr;
  char *pcVar9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::MockSocket> clientSocket;
  shared_ptr<ot::commissioner::MockSocket> serverSocket;
  event_base *eventBase;
  ByteArray kHello;
  ByteArray kWorld;
  Address local_138;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  undefined8 *local_118;
  string local_110;
  AssertHelper local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  AssertHelper local_e0;
  MockSocket *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  event_base *local_c8;
  MockSocketPtr local_c0;
  MockSocketPtr local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_110._M_dataplus._M_p._0_4_ = 0x6c6c6568;
  local_110._M_dataplus._M_p._4_1_ = 0x6f;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_110;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_a0,__l,(allocator_type *)&local_48);
  local_110._M_dataplus._M_p._0_4_ = 0x6c726f77;
  local_110._M_dataplus._M_p._4_4_ = CONCAT31(local_110._M_dataplus._M_p._5_3_,100);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_110;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,__l_00,(allocator_type *)&local_138);
  local_c8 = event_base_new();
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&local_110,"eventBase","nullptr",&local_c8,(void **)&local_138);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xd3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_138.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  sVar4 = local_110._M_string_length;
  if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_110._M_string_length !=
        (undefined8 *)(local_110._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_110._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  Address::FromString((Address *)&local_110,(string *)kClientAddr_abi_cxx11_);
  local_f0.data_ = (AssertHelperData *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::MockSocket,std::allocator<ot::commissioner::MockSocket>,event_base*&,ot::commissioner::Address,unsigned_short&>
            (&local_e8,(MockSocket **)&local_f0,
             (allocator<ot::commissioner::MockSocket> *)&local_138,&local_c8,(Address *)&local_110,
             &kClientPort);
  if ((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_));
  }
  Address::FromString((Address *)&local_110,(string *)kServerAddr_abi_cxx11_);
  local_d8 = (MockSocket *)0x0;
  pcVar9 = (char *)&kServerPort;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::MockSocket,std::allocator<ot::commissioner::MockSocket>,event_base*&,ot::commissioner::Address,unsigned_short&>
            (&local_d0,&local_d8,(allocator<ot::commissioner::MockSocket> *)&local_138,&local_c8,
             (Address *)&local_110,&kServerPort);
  if ((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_));
  }
  local_b0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_d8;
  local_b0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_d0._M_pi;
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
    }
  }
  MockSocket::Connect((MockSocket *)local_f0.data_,&local_b0);
  if (local_b0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_c0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f0.data_;
  local_c0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_e8._M_pi;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
    }
  }
  MockSocket::Connect(local_d8,&local_c0);
  if (local_c0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_138.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,*(char *)&local_f0.data_[3].file);
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(char *)&local_f0.data_[3].file == '\0') {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_138,(AssertionResult *)"clientSocket->IsConnected()",
               "false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdb,(char *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                      local_110._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_));
    }
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  puVar2 = local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_138.mBytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar2);
  }
  bVar1 = (local_d8->super_Socket).mIsConnected;
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_138.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar1);
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1 == false) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_138,(AssertionResult *)"serverSocket->IsConnected()",
               "false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdc,(char *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                      local_110._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_));
    }
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  puVar2 = local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_138.mBytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar2);
  }
  (**(code **)(*(long *)local_f0.data_ + 0x28))(&local_110);
  (*(local_d8->super_Socket)._vptr_Socket[3])(&local_138);
  testing::internal::CmpHelperEQ<ot::commissioner::Address,ot::commissioner::Address>
            ((internal *)&local_120,"clientSocket->GetPeerAddr()","serverSocket->GetLocalAddr()",
             (Address *)&local_110,&local_138);
  if (local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_));
  }
  if (local_120._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_118 == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = (char *)*local_118;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xde,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((long *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  puVar3 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar3);
  }
  uVar7 = (**(code **)(*(long *)local_f0.data_ + 0x20))();
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_138.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,uVar7);
  iVar8 = (*(local_d8->super_Socket)._vptr_Socket[2])();
  local_120._M_head_impl._0_2_ = (short)iVar8;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&local_110,"clientSocket->GetPeerPort()","serverSocket->GetLocalPort()",
             (unsigned_short *)&local_138,(unsigned_short *)&local_120);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdf,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_138.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  sVar4 = local_110._M_string_length;
  if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_110._M_string_length !=
        (undefined8 *)(local_110._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_110._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  (**(code **)(*(long *)local_f0.data_ + 0x18))(&local_110);
  (*(local_d8->super_Socket)._vptr_Socket[5])(&local_138);
  testing::internal::CmpHelperEQ<ot::commissioner::Address,ot::commissioner::Address>
            ((internal *)&local_120,"clientSocket->GetLocalAddr()","serverSocket->GetPeerAddr()",
             (Address *)&local_110,&local_138);
  if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_138.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_));
  }
  if (local_120._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_118 == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = (char *)*local_118;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xe0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((long *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                     local_110._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(local_118);
  }
  uVar7 = (**(code **)(*(long *)local_f0.data_ + 0x10))();
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_138.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,uVar7);
  iVar8 = (*(local_d8->super_Socket)._vptr_Socket[4])();
  local_120._M_head_impl._0_2_ = (short)iVar8;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&local_110,"clientSocket->GetLocalPort()","serverSocket->GetPeerPort()",
             (unsigned_short *)&local_138,(unsigned_short *)&local_120);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xe1,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_138.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  sVar4 = local_110._M_string_length;
  if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_110._M_string_length !=
        (undefined8 *)(local_110._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_110._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  pMVar6 = local_d8;
  local_68 = (undefined8 *)0x0;
  uStack_60 = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68 = (undefined8 *)operator_new(0x18);
  *local_68 = &local_d8;
  local_68[1] = &local_a0;
  local_68[2] = &local_48;
  pcStack_50 = std::
               _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:227:35)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:227:35)>
             ::_M_manager;
  (*(pMVar6->super_Socket)._vptr_Socket[8])(pMVar6);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  AVar5.data_ = local_f0.data_;
  local_88 = (undefined8 *)0x0;
  uStack_80 = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88 = (undefined8 *)operator_new(0x18);
  *local_88 = &local_f0;
  local_88[1] = &local_48;
  local_88[2] = &local_c8;
  pcStack_70 = std::
               _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:238:35)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:238:35)>
             ::_M_manager;
  (**(code **)(*(long *)AVar5.data_ + 0x40))(AVar5.data_);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  iVar8 = (**(code **)(*(long *)local_f0.data_ + 0x30))
                    (local_f0.data_,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(long)iVar8;
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_110,"static_cast<size_t>(len)","kHello.size()",
             (unsigned_long *)&local_138,(unsigned_long *)&local_120);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xfa,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_138.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  sVar4 = local_110._M_string_length;
  if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_110._M_string_length !=
        (undefined8 *)(local_110._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_110._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  iVar8 = event_base_loop(local_c8,4);
  local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_138.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,iVar8);
  local_120._M_head_impl = local_120._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_110,"event_base_loop(eventBase, 0x04)","0",(int *)&local_138,
             (int *)&local_120);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar9 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar9 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xfc,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((long *)local_138.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_138.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((undefined8 *)local_110._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_110._M_string_length !=
        (undefined8 *)(local_110._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_110._M_string_length);
    }
    operator_delete((void *)local_110._M_string_length);
  }
  event_base_free(local_c8);
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SocketTest, MockSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    auto clientSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kClientAddr), kClientPort);
    auto serverSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kServerAddr), kServerPort);

    clientSocket->Connect(serverSocket);
    serverSocket->Connect(clientSocket);

    EXPECT_TRUE(clientSocket->IsConnected());
    EXPECT_TRUE(serverSocket->IsConnected());

    EXPECT_EQ(clientSocket->GetPeerAddr(), serverSocket->GetLocalAddr());
    EXPECT_EQ(clientSocket->GetPeerPort(), serverSocket->GetLocalPort());
    EXPECT_EQ(clientSocket->GetLocalAddr(), serverSocket->GetPeerAddr());
    EXPECT_EQ(clientSocket->GetLocalPort(), serverSocket->GetPeerPort());

    serverSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = serverSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kHello.size());

            len = serverSocket->Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    clientSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = clientSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());

            event_base_loopbreak(eventBase);
        }
    });

    int len = clientSocket->Send(&kHello[0], kHello.size());
    EXPECT_EQ(static_cast<size_t>(len), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}